

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAddFunctionOrderBy(Parse *pParse,Expr *pExpr,ExprList *pOrderBy)

{
  byte *pbVar1;
  sqlite3 *db;
  Expr *pEVar2;
  
  if (pOrderBy == (ExprList *)0x0) {
    return;
  }
  db = pParse->db;
  if (pExpr != (Expr *)0x0) {
    if (((pExpr->x).pList == (ExprList *)0x0) || (((pExpr->x).pList)->nExpr == 0)) {
      sqlite3ParserAddCleanup(pParse,sqlite3ExprListDeleteGeneric,pOrderBy);
      return;
    }
    if (((pExpr->flags & 0x1000000) == 0) || (((pExpr->y).pWin)->eFrmType == 0xa7)) {
      pEVar2 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
      if (pEVar2 != (Expr *)0x0) {
        pEVar2->op = '\0';
        pEVar2->affExpr = '\0';
        pEVar2->op2 = '\0';
        pEVar2->field_0x3 = 0;
        pEVar2->flags = 0;
        (pEVar2->u).zToken = (char *)0x0;
        pEVar2->iColumn = 0;
        pEVar2->iAgg = 0;
        pEVar2->w = (anon_union_4_2_009eaf8f_for_w)0x0;
        pEVar2->pAggInfo = (AggInfo *)0x0;
        (pEVar2->x).pList = (ExprList *)0x0;
        pEVar2->nHeight = 0;
        pEVar2->iTable = 0;
        pEVar2->pLeft = (Expr *)0x0;
        pEVar2->pRight = (Expr *)0x0;
        (pEVar2->y).pTab = (Table *)0x0;
        pEVar2->op = 0x92;
        pEVar2->iAgg = -1;
        pEVar2->nHeight = 1;
        (pEVar2->x).pList = pOrderBy;
        pExpr->pLeft = pEVar2;
        pbVar1 = (byte *)((long)&pEVar2->flags + 2);
        *pbVar1 = *pbVar1 | 2;
        return;
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"ORDER BY may not be used with non-aggregate %#T()",pExpr);
    }
  }
  exprListDeleteNN(db,pOrderBy);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAddFunctionOrderBy(
  Parse *pParse,        /* Parsing context */
  Expr *pExpr,          /* The function call to which ORDER BY is to be added */
  ExprList *pOrderBy    /* The ORDER BY clause to add */
){
  Expr *pOB;
  sqlite3 *db = pParse->db;
  if( NEVER(pOrderBy==0) ){
    assert( db->mallocFailed );
    return;
  }
  if( pExpr==0 ){
    assert( db->mallocFailed );
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }
  assert( pExpr->op==TK_FUNCTION );
  assert( pExpr->pLeft==0 );
  assert( ExprUseXList(pExpr) );
  if( pExpr->x.pList==0 || NEVER(pExpr->x.pList->nExpr==0) ){
    /* Ignore ORDER BY on zero-argument aggregates */
    sqlite3ParserAddCleanup(pParse, sqlite3ExprListDeleteGeneric, pOrderBy);
    return;
  }
  if( IsWindowFunc(pExpr) ){
    sqlite3ExprOrderByAggregateError(pParse, pExpr);
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }

  pOB = sqlite3ExprAlloc(db, TK_ORDER, 0, 0);
  if( pOB==0 ){
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }
  pOB->x.pList = pOrderBy;
  assert( ExprUseXList(pOB) );
  pExpr->pLeft = pOB;
  ExprSetProperty(pOB, EP_FullSize);
}